

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O1

void __thiscall Assimp::FBX::Node::DumpChildrenAscii(Node *this,ostream *s,int indent)

{
  int iVar1;
  pointer pNVar2;
  ulong uVar3;
  long lVar4;
  
  if ((((this->children).super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        (this->children).super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>.
        _M_impl.super__Vector_impl_data._M_start) || (this->force_has_children == true)) &&
     (pNVar2 = (this->children).
               super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>._M_impl.
               super__Vector_impl_data._M_start,
     (this->children).super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>.
     _M_impl.super__Vector_impl_data._M_finish != pNVar2)) {
    lVar4 = 0;
    uVar3 = 0;
    do {
      iVar1 = std::__cxx11::string::compare
                        ((char *)((long)&(pNVar2->name)._M_dataplus._M_p + lVar4));
      if (iVar1 != 0) {
        DumpAscii((Node *)((long)&(((this->children).
                                    super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus.
                                  _M_p + lVar4),s,indent);
      }
      uVar3 = uVar3 + 1;
      pNVar2 = (this->children).
               super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x70;
    } while (uVar3 < (ulong)(((long)(this->children).
                                    super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar2 >> 4)
                            * 0x6db6db6db6db6db7));
  }
  return;
}

Assistant:

void FBX::Node::DumpChildrenAscii(std::ostream& s, int indent)
{
    // children will need a lot of padding and corralling
    if (children.size() || force_has_children) {
        for (size_t i = 0; i < children.size(); ++i) {
            // no compression in ascii files, so skip this node if it exists
            if (children[i].name == "EncryptionType") { continue; }
            // the child can dump itself
            children[i].DumpAscii(s, indent);
        }
    }
}